

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O0

void __thiscall
t_java_generator::generate_get_struct_desc(t_java_generator *this,ostream *out,t_struct *tstruct)

{
  ostream *poVar1;
  t_struct *tstruct_local;
  ostream *out_local;
  t_java_generator *this_local;
  
  poVar1 = t_generator::indent((t_generator *)this,out);
  poVar1 = std::operator<<(poVar1,"@Override");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = t_generator::indent((t_generator *)this,out);
  poVar1 = std::operator<<(poVar1,"protected org.apache.thrift.protocol.TStruct getStructDesc() {");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = t_generator::indent((t_generator *)this,out);
  poVar1 = std::operator<<(poVar1,"  return STRUCT_DESC;");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = t_generator::indent((t_generator *)this,out);
  poVar1 = std::operator<<(poVar1,"}");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_java_generator::generate_get_struct_desc(ostream& out, t_struct* tstruct) {
  (void)tstruct;
  indent(out) << "@Override" << endl;
  indent(out) << "protected org.apache.thrift.protocol.TStruct getStructDesc() {" << endl;
  indent(out) << "  return STRUCT_DESC;" << endl;
  indent(out) << "}" << endl;
}